

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> * __thiscall
pbrt::ParameterDictionary::
lookupArray<pbrt::Point3<float>,pstd::vector<double,pstd::pmr::polymorphic_allocator<double>>const&(*)(pbrt::ParsedParameter_const&),pbrt::Point3<float>(*)(double_const*,pbrt::FileLoc_const*)>
          (ParameterDictionary *this,string *name,ParameterType type,char *typeName,int nPerItem,
          _func_vector<double,_pstd::pmr::polymorphic_allocator<double>_>_ptr_ParsedParameter_ptr
          *getValues,_func_Point3<float>_double_ptr_FileLoc_ptr *convert)

{
  undefined8 uVar1;
  __type _Var2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RSI;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDI;
  code *in_stack_00000008;
  ParsedParameter *p;
  const_iterator __end2;
  const_iterator __begin2;
  ParsedParameterVector *__range2;
  undefined4 in_stack_00000048;
  char *in_stack_ffffffffffffff98;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *this_00;
  
  this_00 = in_RDI;
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
          ::begin(in_RSI);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
          ::end(this_00);
  while( true ) {
    if (__lhs == __rhs) {
      memset(this_00,0,0x18);
      std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::vector
                ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)0x758780);
      return (vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)in_RDI;
    }
    uVar1 = *(undefined8 *)__lhs;
    _Var2 = std::operator==(__lhs,__rhs);
    if ((_Var2) &&
       (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )this_00,in_stack_ffffffffffffff98), bVar3)) break;
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &__lhs->_M_string_length;
  }
  (*in_stack_00000008)(uVar1);
  returnArray<pbrt::Point3<float>,pstd::vector<double,pstd::pmr::polymorphic_allocator<double>>,pbrt::Point3<float>(*)(double_const*,pbrt::FileLoc_const*)>
            ((vector<double,_pstd::pmr::polymorphic_allocator<double>_> *)
             CONCAT44(type,in_stack_00000048),(ParsedParameter *)typeName,nPerItem,
             (_func_Point3<float>_double_ptr_FileLoc_ptr *)__range2);
  return (vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)in_RDI;
}

Assistant:

std::vector<ReturnType> ParameterDictionary::lookupArray(const std::string &name,
                                                         ParameterType type,
                                                         const char *typeName,
                                                         int nPerItem, G getValues,
                                                         C convert) const {
    for (const ParsedParameter *p : params)
        if (p->name == name && p->type == typeName)
            return returnArray<ReturnType>(getValues(*p), *p, nPerItem, convert);

    return {};
}